

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

bool TtfUtil::CalcAbsolutePoints(int *prgnX,int *prgnY,size_t cnPoints)

{
  size_t i;
  int nY;
  int nX;
  size_t cnPoints_local;
  int *prgnY_local;
  int *prgnX_local;
  
  nX = *prgnX;
  nY = *prgnY;
  for (i = 1; i < cnPoints; i = i + 1) {
    prgnX[i] = nX + prgnX[i];
    nX = prgnX[i];
    prgnY[i] = nY + prgnY[i];
    nY = prgnY[i];
  }
  return true;
}

Assistant:

bool CalcAbsolutePoints(int * prgnX, int * prgnY, size_t cnPoints)
{
	int nX = prgnX[0];
	int nY = prgnY[0];
	for (size_t i = 1; i < cnPoints; ++i)
	{
		prgnX[i] += nX;
		nX = prgnX[i];
		prgnY[i] += nY;
		nY = prgnY[i];
	}

	return true;
}